

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O1

void __thiscall CVmObjTable::delete_global_var(CVmObjTable *this,vm_globalvar_t *var)

{
  if (var->nxt != (vm_globalvar_t *)0x0) {
    var->nxt->prv = var->prv;
  }
  if ((CVmObjTable *)var->prv != (CVmObjTable *)0x0) {
    this = (CVmObjTable *)var->prv;
  }
  this->global_var_head_ = var->nxt;
  if (var != (vm_globalvar_t *)0x0) {
    operator_delete(var,0x20);
    return;
  }
  return;
}

Assistant:

void CVmObjTable::delete_global_var(vm_globalvar_t *var)
{
    /* unlink it from the list of globals */
    if (var->nxt != 0)
        var->nxt->prv = var->prv;

    if (var->prv != 0)
        var->prv->nxt = var->nxt;
    else
        global_var_head_ = var->nxt;

    /* delete the memory */
    delete var;
}